

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_classify_nosse2.cpp
# Opt level: O2

int ClassifyLine2(node_t *node,FSimpleVert *v1,FSimpleVert *v2,int *sidev)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  uVar1 = node->x;
  uVar3 = node->y;
  uVar2 = node->dx;
  uVar4 = node->dy;
  dVar12 = (double)(int)uVar2;
  dVar13 = (double)(int)uVar4;
  dVar11 = ((double)(int)uVar3 - (double)(*v1).y) * dVar12 -
           ((double)(int)uVar1 - (double)(*v1).x) * dVar13;
  dVar10 = ((double)(int)uVar3 - (double)v2->y) * dVar12 -
           dVar13 * ((double)(int)uVar1 - (double)v2->x);
  if (dVar11 <= -17179869184.0) {
    if (dVar10 <= -17179869184.0) {
      sidev[0] = 1;
      sidev[1] = 1;
      return 1;
    }
    if (17179869184.0 <= dVar10) {
      uVar7 = 0xffffffff00000001;
LAB_00471d90:
      *(undefined8 *)sidev = uVar7;
      return -1;
    }
  }
  else {
    if (dVar11 < 17179869184.0) {
      bVar5 = ABS(dVar10) < 17179869184.0;
      bVar6 = true;
      goto LAB_00471c8f;
    }
    if (17179869184.0 <= dVar10) {
      sidev[0] = -1;
      sidev[1] = -1;
      return 0;
    }
    if (dVar10 <= -17179869184.0) {
      uVar7 = 0x1ffffffff;
      goto LAB_00471d90;
    }
  }
  bVar5 = true;
  bVar6 = false;
LAB_00471c8f:
  dVar12 = 1.0 / (dVar13 * dVar13 + dVar12 * dVar12);
  if (bVar6) {
    uVar8 = ((dVar11 <= 0.0) - 1) + (uint)(dVar11 <= 0.0);
    if (dVar11 * dVar11 * dVar12 < 42.94967296) {
      uVar8 = 0;
    }
  }
  else {
    uVar8 = (uint)(dVar11 <= 0.0) * 2 - 1;
  }
  *sidev = uVar8;
  if ((!bVar5) || (uVar9 = 0, 42.94967296 <= dVar12 * dVar10 * dVar10)) {
    uVar9 = (uint)(dVar10 <= 0.0) * 2 - 1;
  }
  sidev[1] = uVar9;
  if ((uVar9 | uVar8) == 0) {
    if (node->dx == 0) {
      if (node->dy < 1) {
        if ((node->dy < 0) && (v2->y < v1->y)) {
          return 0;
        }
      }
      else if (v1->y < v2->y) {
        return 0;
      }
    }
    else if (node->dx < 1) {
      if (v2->x < v1->x) {
        return 0;
      }
    }
    else if (v1->x < v2->x) {
      return 0;
    }
    return 1;
  }
  if (((int)uVar8 < 1) && ((int)uVar9 < 1)) {
    return 0;
  }
  return (int)(uVar9 | uVar8) >> 0x1f | 1;
}

Assistant:

int ClassifyLine2 (node_t &node, const FSimpleVert *v1, const FSimpleVert *v2, int sidev[2])
{
	double d_x1 = double(node.x);
	double d_y1 = double(node.y);
	double d_dx = double(node.dx);
	double d_dy = double(node.dy);
	double d_xv1 = double(v1->x);
	double d_xv2 = double(v2->x);
	double d_yv1 = double(v1->y);
	double d_yv2 = double(v2->y);

	double s_num1 = (d_y1 - d_yv1) * d_dx - (d_x1 - d_xv1) * d_dy;
	double s_num2 = (d_y1 - d_yv2) * d_dx - (d_x1 - d_xv2) * d_dy;

	int nears = 0;

	if (s_num1 <= -FAR_ENOUGH)
	{
		if (s_num2 <= -FAR_ENOUGH)
		{
			sidev[0] = sidev[1] = 1;
			return 1;
		}
		if (s_num2 >= FAR_ENOUGH)
		{
			sidev[0] = 1;
			sidev[1] = -1;
			return -1;
		}
		nears = 1;
	}
	else if (s_num1 >= FAR_ENOUGH)
	{
		if (s_num2 >= FAR_ENOUGH)
		{
			sidev[0] = sidev[1] = -1;
			return 0;
		}
		if (s_num2 <= -FAR_ENOUGH)
		{
			sidev[0] = -1;
			sidev[1] = 1;
			return -1;
		}
		nears = 1;
	}
	else
	{
		nears = 2 | int(fabs(s_num2) < FAR_ENOUGH);
	}

	if (nears)
	{
		double l = 1.f / (d_dx*d_dx + d_dy*d_dy);
		if (nears & 2)
		{
			double dist = s_num1 * s_num1 * l;
			if (dist < SIDE_EPSILON*SIDE_EPSILON)
			{
				sidev[0] = 0;
			}
			else
			{
				sidev[0] = s_num1 > 0.0 ? -1 : 1;
			}
		}
		else
		{
			sidev[0] = s_num1 > 0.0 ? -1 : 1;
		}
		if (nears & 1)
		{
			double dist = s_num2 * s_num2 * l;
			if (dist < SIDE_EPSILON*SIDE_EPSILON)
			{
				sidev[1] = 0;
			}
			else
			{
				sidev[1] = s_num2 > 0.0 ? -1 : 1;
			}
		}
		else
		{
			sidev[1] = s_num2 > 0.0 ? -1 : 1;
		}
	}
	else
	{
		sidev[0] = s_num1 > 0.0 ? -1 : 1;
		sidev[1] = s_num2 > 0.0 ? -1 : 1;
	}

	if ((sidev[0] | sidev[1]) == 0)
	{ // seg is coplanar with the splitter, so use its orientation to determine
	  // which child it ends up in. If it faces the same direction as the splitter,
	  // it goes in front. Otherwise, it goes in back.

		if (node.dx != 0)
		{
			if ((node.dx > 0 && v2->x > v1->x) || (node.dx < 0 && v2->x < v1->x))
			{
				return 0;
			}
			else
			{
				return 1;
			}
		}
		else
		{
			if ((node.dy > 0 && v2->y > v1->y) || (node.dy < 0 && v2->y < v1->y))
			{
				return 0;
			}
			else
			{
				return 1;
			}
		}
	}
	else if (sidev[0] <= 0 && sidev[1] <= 0)
	{
		return 0;
	}
	else if (sidev[0] >= 0 && sidev[1] >= 0)
	{
		return 1;
	}
	return -1;
}